

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

void ffcmps(char *templt,char *colname,int casesen,int *match,int *exact)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  ushort **ppuVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  char col [71];
  char temp [71];
  char local_c8 [70];
  undefined1 local_82;
  char local_78 [70];
  undefined1 local_32;
  
  *match = 0;
  *exact = 1;
  strncpy(local_78,templt,0x47);
  strncpy(local_c8,colname,0x47);
  local_32 = 0;
  local_82 = 0;
  sVar6 = strlen(local_78);
  if (-1 < (int)sVar6 + -1) {
    do {
      uVar3 = (int)sVar6 - 1;
      sVar6 = (size_t)uVar3;
      if (local_78[sVar6] != ' ') break;
      local_78[sVar6] = '\0';
    } while (0 < (int)uVar3);
  }
  sVar6 = strlen(local_c8);
  if (-1 < (int)sVar6 + -1) {
    do {
      uVar3 = (int)sVar6 - 1;
      sVar6 = (size_t)uVar3;
      if (local_c8[sVar6] != ' ') break;
      local_c8[sVar6] = '\0';
    } while (0 < (int)uVar3);
  }
  if (casesen == 0) {
    ffupch(local_78);
    ffupch(local_c8);
  }
  if ((local_78[0] == local_c8[0]) && (iVar4 = strcmp(local_78,local_c8), iVar4 == 0)) {
LAB_0017fd00:
    *match = 1;
  }
  else {
    *exact = 0;
    bVar2 = true;
    uVar10 = 0;
    iVar5 = 0;
    iVar15 = 0;
    iVar4 = 0;
    do {
      iVar14 = iVar15 + 1;
      iVar13 = (int)uVar10;
LAB_0017fbc4:
      bVar12 = bVar2;
      if (local_78[iVar13] == '\0') {
        if (local_c8[iVar5] == '\0') goto LAB_0017fd00;
        iVar13 = iVar4;
        iVar15 = iVar14;
        if (bVar12) {
          return;
        }
      }
      else {
        iVar15 = iVar5;
        if (local_c8[iVar5] == '\0') {
          if (local_78[iVar13] != '*') {
            return;
          }
          if (local_78[(long)iVar13 + 1] != '\0') {
            return;
          }
          goto LAB_0017fd00;
        }
      }
      lVar9 = (long)iVar13;
      cVar8 = local_78[lVar9];
      if (cVar8 == '?') {
LAB_0017fc3d:
        iVar15 = iVar15 + 1;
LAB_0017fc40:
        iVar13 = iVar13 + 1;
        iVar5 = iVar15;
        bVar2 = bVar12;
        goto LAB_0017fbc4;
      }
      cVar1 = local_c8[iVar15];
      if (cVar8 == cVar1) goto LAB_0017fc3d;
      if (cVar8 == '#') {
        ppuVar7 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar7 + (long)cVar1 * 2 + 1) & 8) == 0) goto LAB_0017fc5e;
        pcVar11 = local_c8 + (long)iVar15 + 1;
        do {
          cVar8 = *pcVar11;
          iVar15 = iVar15 + 1;
          pcVar11 = pcVar11 + 1;
        } while ((*(byte *)((long)*ppuVar7 + (long)cVar8 * 2 + 1) & 8) != 0);
        goto LAB_0017fc40;
      }
LAB_0017fc5e:
      if (cVar8 != '*') {
        iVar13 = iVar4;
        iVar5 = iVar14;
        bVar2 = false;
        if (bVar12) {
          return;
        }
        goto LAB_0017fbc4;
      }
      if ((local_78[lVar9 + 1] & 0xdfU) == 0) goto LAB_0017fd00;
      uVar10 = lVar9 + 1;
      cVar8 = local_c8[iVar15];
      iVar5 = iVar15;
      if (cVar8 == '\0') {
        bVar12 = true;
      }
      else {
        pcVar11 = local_c8 + (long)iVar15 + 1;
        bVar2 = false;
        do {
          if (local_78[(int)uVar10] == cVar8) {
            bVar2 = true;
          }
          uVar10 = (ulong)((int)uVar10 + (uint)(local_78[(int)uVar10] == cVar8));
          cVar8 = *pcVar11;
          bVar12 = !bVar2;
          iVar5 = iVar5 + 1;
        } while ((cVar8 != '\0') && (pcVar11 = pcVar11 + 1, !bVar2));
      }
      bVar2 = false;
      iVar4 = iVar13;
    } while (!bVar12);
  }
  return;
}

Assistant:

void ffcmps(char *templt,   /* I - input template (may have wildcards)      */
            char *colname,  /* I - full column name up to 68 + 1 chars long */
            int  casesen,   /* I - case sensitive string comparison? 1=yes  */
            int  *match,    /* O - do template and colname match? 1=yes     */
            int  *exact)    /* O - do strings exactly match, or wildcards   */
/*
  compare the template to the string and test if they match.
  The strings are limited to 68 characters or less (the max. length
  of a FITS string keyword value.  This routine reports whether
  the two strings match and whether the match is exact or
  involves wildcards.

  This algorithm is very similar to the way unix filename wildcards
  work except that this first treats a wild card as a literal character
  when looking for a match.  If there is no literal match, then
  it interpretes it as a wild card.  So the template 'AB*DE'
  is considered to be an exact rather than a wild card match to
  the string 'AB*DE'.  The '#' wild card in the template string will 
  match any consecutive string of decimal digits in the colname.
  
*/
{
    int ii, found, t1, s1, wildsearch = 0, tsave = 0, ssave = 0;
    char temp[FLEN_VALUE], col[FLEN_VALUE];

    *match = FALSE;
    *exact = TRUE;

    strncpy(temp, templt, FLEN_VALUE); /* copy strings to work area */
    strncpy(col, colname, FLEN_VALUE);
    temp[FLEN_VALUE - 1] = '\0';  /* make sure strings are terminated */
    col[FLEN_VALUE - 1]  = '\0';

    /* truncate trailing non-significant blanks */
    for (ii = strlen(temp) - 1; ii >= 0 && temp[ii] == ' '; ii--)
        temp[ii] = '\0';

    for (ii = strlen(col) - 1; ii >= 0 && col[ii] == ' '; ii--)
        col[ii] = '\0';
       
    if (!casesen)
    {             /* convert both strings to uppercase before comparison */
        ffupch(temp);
        ffupch(col);
    }

    if (!FSTRCMP(temp, col) )
    {
        *match = TRUE;     /* strings exactly match */
        return;
    }

    *exact = FALSE;    /* strings don't exactly match */

    t1 = 0;   /* start comparison with 1st char of each string */
    s1 = 0;

    while(1)  /* compare corresponding chars in each string */
    {
      if (temp[t1] == '\0' && col[s1] == '\0')
      { 
         /* completely scanned both strings so they match */
         *match = TRUE;
         return;
      }
      else if (temp[t1] == '\0')
      { 
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
            /* reached end of template string so they don't match */
            return;
        }
      }
      else if (col[s1] == '\0')
      { 
         /* reached end of other string; they match if the next */
         /* character in the template string is a '*' wild card */

        if (temp[t1] == '*' && temp[t1 + 1] == '\0')
        {
           *match = TRUE;
        }

        return;
      }

      if (temp[t1] == col[s1] || (temp[t1] == '?') )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers and loop back again */
      }
      else if (temp[t1] == '#' && isdigit((int) col[s1]) )
      {
        s1++;  /* corresponding chars in the 2 strings match */
        t1++;  /* increment both pointers */

        /* find the end of the string of digits */
        while (isdigit((int) col[s1]) ) 
            s1++;        
      }
      else if (temp[t1] == '*')
      {

        /* save current string locations, in case we need to restart */
        wildsearch = 1;
        tsave = t1;
        ssave = s1;

        /* get next char from template and look for it in the col name */
        t1++;
        if (temp[t1] == '\0' || temp[t1] == ' ')
        {
          /* reached end of template so strings match */
          *match = TRUE;
          return;
        }

        found = FALSE;
        while (col[s1] && !found)
        {
          if (temp[t1] == col[s1])
          {
            t1++;  /* found matching characters; incre both pointers */
            s1++;  /* and loop back to compare next chars */
            found = TRUE;
          }
          else
            s1++;  /* increment the column name pointer and try again */
        }

        if (!found)
        {
          return;  /* hit end of column name and failed to find a match */
        }
      }
      else
      {
        if (wildsearch)
        {
            /* 
               the previous wildcard search may have been going down
               a blind alley.  Backtrack, and resume the wildcard
               search with the next character in the string.
            */
            t1 = tsave;
            s1 = ssave + 1;
        }
        else
        {
          return;   /* strings don't match */
        }
      }
    }
}